

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O1

void __thiscall
Eigen::
MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_-1,_1,_false>_>
::makeHouseholderInPlace
          (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
           *this,Scalar *tau,RealScalar *beta)

{
  long lVar1;
  VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1>
  essentialPart;
  VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1>
  local_60;
  
  lVar1 = *(long *)(this + 8);
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
  .m_rows.m_value = lVar1 + -1;
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
  .m_data = (PointerType)(*(long *)this + 8);
  if (lVar1 < 1 &&
      local_60.
      super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
      .m_data != (PointerType)0x0) {
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                  ,0x94,
                  "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
  .m_data = *(PointerType *)this;
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = *(long *)(this + 8);
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data =
       *(PointerType *)(this + 0x18);
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr =
       *(Nested *)(this + 0x28);
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_outerStride =
       *(Index *)(this + 0x30);
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
  .m_outerStride = *(Index *)(this + 0x38);
  local_60.
  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .m_outerStride =
       local_60.
       super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false>
       .
       super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
       .m_xpr.
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
       .m_outerStride;
  if (0 < lVar1) {
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,-1,1,false>>::
    makeHouseholder<Eigen::VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>,_1>>
              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>>
                *)this,&local_60,tau,beta);
    return;
  }
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                ,0x8d,
                "Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void MatrixBase<Derived>::makeHouseholderInPlace(Scalar& tau, RealScalar& beta)
{
  VectorBlock<Derived, internal::decrement_size<Base::SizeAtCompileTime>::ret> essentialPart(derived(), 1, size()-1);
  makeHouseholder(essentialPart, tau, beta);
}